

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::JitAllocator::release(JitAllocator *this,void *rxPtr)

{
  ulong *puVar1;
  uint uVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  Impl *pIVar5;
  __pthread_internal_list *p_Var6;
  long *plVar7;
  uintptr_t uVar8;
  long lVar9;
  byte bVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  long lVar13;
  sbyte sVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long *plVar19;
  uint uVar20;
  pthread_mutex_t *__mutex;
  Error EVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  JitAllocatorBlock *block;
  ulong *puVar25;
  uint32_t *this_00;
  long lVar26;
  int iVar27;
  ulong uVar28;
  JitAllocatorPrivateImpl *impl;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  Compare<(asmjit::_abi_1_10::Support::SortOrder)0> local_79;
  long local_78;
  uint32_t *local_70;
  uint32_t *p;
  pthread_mutex_t *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  pIVar5 = this->_impl;
  if (pIVar5 == (Impl *)JitAllocatorImpl_none) {
    EVar21 = 5;
  }
  else if (rxPtr == (void *)0x0) {
    EVar21 = 2;
  }
  else {
    __mutex = (pthread_mutex_t *)(pIVar5 + 1);
    pthread_mutex_lock(__mutex);
    impl = *(JitAllocatorPrivateImpl **)&pIVar5[4].granularity;
    EVar21 = 3;
    if (impl != (JitAllocatorPrivateImpl *)0x0) {
      this_00 = &pIVar5[4].granularity;
LAB_0010fb39:
      p_Var6 = (impl->lock)._handle.__data.__list.__prev;
      uVar15 = (uint)(rxPtr < p_Var6) -
               (uint)((void *)((long)&p_Var6->__prev + *(long *)&impl->pageSize) <= rxPtr);
      if (uVar15 != 0) goto code_r0x0010fb59;
      lVar13 = *(long *)((long)&(impl->lock)._handle + 0x10);
      uVar28 = (ulong)((long)rxPtr - (long)p_Var6) >> (*(byte *)(lVar13 + 0x1e) & 0x3f);
      lVar26 = *(long *)&impl[1].super_Impl;
      uVar15 = (uint)uVar28;
      uVar24 = uVar28 >> 6 & 0x3ffffff;
      puVar25 = (ulong *)(lVar26 + uVar24 * 8);
      sVar14 = (sbyte)(uVar15 & 0x3f);
      uVar28 = (*puVar25 >> sVar14) << sVar14;
      while (uVar28 == 0) {
        puVar1 = puVar25 + 1;
        puVar25 = puVar25 + 1;
        uVar28 = *puVar1;
      }
      lVar9 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      uVar28 = lVar9 + ((long)puVar25 - lVar26) * 8;
      uVar16 = (int)uVar28 + 1;
      *(long *)(pIVar5 + 4) = *(long *)(pIVar5 + 4) + -1;
      uVar20 = uVar16 - uVar15;
      uVar23 = (ulong)uVar20;
      *(long *)(lVar13 + 0x28) = *(long *)(lVar13 + 0x28) - uVar23;
      iVar27 = *(int *)&(impl->tree)._root;
      p = (uint32_t *)CONCAT44(p._4_4_,iVar27);
      iVar27 = iVar27 - uVar20;
      uVar17 = *(uint *)&impl->pools;
      if (uVar15 < *(uint *)&impl->pools) {
        uVar17 = uVar15;
      }
      uVar2 = *(uint *)((long)&impl->pools + 4);
      if (uVar2 <= uVar16) {
        uVar2 = uVar16;
      }
      *(int *)&(impl->tree)._root = iVar27;
      *(uint *)&impl->pools = uVar17;
      *(uint *)((long)&impl->pools + 4) = uVar2;
      local_60 = __mutex;
      if (uVar16 != uVar15) {
        local_38 = impl->poolCount;
        uVar18 = 0x40 - (ulong)(uVar15 & 0x3f);
        if (uVar23 < uVar18) {
          uVar18 = uVar23;
        }
        puVar25 = (ulong *)(uVar24 * 8 + 8 + local_38);
        puVar25[-1] = puVar25[-1] & ~((0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU)) << sVar14);
        uVar22 = uVar23 - uVar18;
        if (0x3f < uVar22) {
          uVar23 = (uVar23 - uVar18) - 0x40;
          local_48 = uVar23 >> 6;
          local_78 = lVar13;
          local_70 = this_00;
          local_54 = iVar27;
          local_50 = uVar24;
          local_40 = lVar26;
          memset(puVar25,0,local_48 * 8 + 8);
          uVar22 = (ulong)((uint)uVar23 & 0x3f);
          puVar25 = (ulong *)(local_38 + local_50 * 8 + local_48 * 8 + 0x10);
          this_00 = local_70;
          lVar13 = local_78;
          lVar26 = local_40;
          iVar27 = local_54;
        }
        if (uVar22 != 0) {
          *puVar25 = *puVar25 & ~(0xffffffffffffffffU >> (-(char)uVar22 & 0x3fU));
        }
      }
      bVar10 = (byte)uVar28 & 0x3f;
      puVar25 = (ulong *)(lVar26 + (uVar28 >> 6 & 0x3ffffff) * 8);
      *puVar25 = *puVar25 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
      if ((uint)p == uVar20) {
        *(undefined4 *)&impl->pools = 0;
        sVar11 = impl->allocationCount;
        uVar3 = *(undefined4 *)((long)&impl->allocationCount + 4);
        *(undefined4 *)((long)&impl->pools + 4) = uVar3;
        *(undefined4 *)((long)&(impl->tree)._root + 4) = uVar3;
        *(uint *)&impl->allocationCount = ((uint)sVar11 & 0xfffffffc) + 1;
      }
      else {
        *(byte *)&impl->allocationCount = (byte)impl->allocationCount | 2;
      }
      if ((pIVar5->options & kFillUnusedMemory) != kNone) {
        p_Var6 = (impl->lock)._handle.__data.__list.__next;
        uVar28 = (ulong)(uVar15 * *(ushort *)(lVar13 + 0x1c));
        p = (uint32_t *)((long)&p_Var6->__prev + uVar28);
        uVar20 = *(ushort *)(lVar13 + 0x1c) * uVar20;
        local_78 = lVar13;
        local_70 = this_00;
        VirtMem::protectJitMemory(kReadWrite);
        auVar12 = _DAT_0014bce0;
        if (3 < uVar20) {
          uVar4 = pIVar5->fillPattern;
          lVar13 = (ulong)(uVar20 >> 2) - 1;
          auVar29._8_4_ = (int)lVar13;
          auVar29._0_8_ = lVar13;
          auVar29._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar24 = 0;
          auVar29 = auVar29 ^ _DAT_0014bce0;
          auVar30 = _DAT_0014bcc0;
          auVar31 = _DAT_0014bcd0;
          do {
            auVar32 = auVar31 ^ auVar12;
            iVar27 = auVar29._4_4_;
            if ((bool)(~(auVar32._4_4_ == iVar27 && auVar29._0_4_ < auVar32._0_4_ ||
                        iVar27 < auVar32._4_4_) & 1)) {
              *(uint32_t *)((long)&p_Var6->__prev + uVar24 * 4 + uVar28) = uVar4;
            }
            if ((auVar32._12_4_ != auVar29._12_4_ || auVar32._8_4_ <= auVar29._8_4_) &&
                auVar32._12_4_ <= auVar29._12_4_) {
              *(uint32_t *)((long)&p_Var6->__prev + uVar24 * 4 + uVar28 + 4) = uVar4;
            }
            auVar32 = auVar30 ^ auVar12;
            iVar33 = auVar32._4_4_;
            if (iVar33 <= iVar27 && (iVar33 != iVar27 || auVar32._0_4_ <= auVar29._0_4_)) {
              *(uint32_t *)((long)&p_Var6->__next + uVar24 * 4 + uVar28) = uVar4;
              *(uint32_t *)((long)&p_Var6->__next + uVar24 * 4 + uVar28 + 4) = uVar4;
            }
            uVar24 = uVar24 + 4;
            lVar13 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 4;
            auVar31._8_8_ = lVar13 + 4;
            lVar13 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar13 + 4;
          } while (((uVar20 >> 2) + 3 & 0xfffffffc) != uVar24);
        }
        VirtMem::protectJitMemory(kReadExecute);
        VirtMem::flushInstructionCache(p,(ulong)uVar20);
        iVar27 = *(int *)&(impl->tree)._root;
        this_00 = local_70;
        lVar13 = local_78;
      }
      EVar21 = 0;
      __mutex = local_60;
      if (iVar27 == 0) {
        if ((*(char *)(lVar13 + 0x1f) == '\0') && ((pIVar5->options & kImmediateRelease) == kNone))
        {
          *(undefined1 *)(lVar13 + 0x1f) = 1;
        }
        else {
          plVar7 = *(long **)((long)&(impl->lock)._handle + 0x10);
          if ((JitAllocatorPrivateImpl *)plVar7[2] == impl) {
            lVar13 = (impl->lock)._handle.__align;
            if (lVar13 == 0) {
              lVar13 = *(long *)((long)&(impl->lock)._handle + 8);
            }
            plVar7[2] = lVar13;
          }
          ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock>::
          remove<asmjit::_abi_1_10::Support::Compare<(asmjit::_abi_1_10::Support::SortOrder)0>>
                    ((ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock> *)this_00,(ZoneTreeNode *)impl,
                     &local_79);
          uVar8 = (impl->lock)._handle.__align;
          lVar13 = *(long *)((long)&(impl->lock)._handle + 8);
          plVar19 = (long *)(uVar8 + 0x18);
          if (uVar8 == 0) {
            plVar19 = plVar7;
          }
          *plVar19 = lVar13;
          block = (JitAllocatorBlock *)(lVar13 + 0x10);
          if (lVar13 == 0) {
            block = (JitAllocatorBlock *)(plVar7 + 1);
          }
          (block->super_ZoneTreeNodeT<asmjit::_abi_1_10::JitAllocatorBlock>).super_ZoneTreeNode.
          _rbNodeData[0] = uVar8;
          *(undefined1 (*) [16])&(impl->lock)._handle = (undefined1  [16])0x0;
          *(int *)(plVar7 + 3) = (int)plVar7[3] + -1;
          uVar15 = *(uint *)((long)&impl->allocationCount + 4);
          plVar7[4] = plVar7[4] - (ulong)uVar15;
          plVar7[6] = plVar7[6] - (ulong)((uVar15 + 0x3f >> 2 & 0xfffffff0) + 0x68);
          JitAllocatorImpl_deleteBlock(impl,block);
          __mutex = local_60;
        }
      }
    }
LAB_0010ff0c:
    pthread_mutex_unlock(__mutex);
  }
  return EVar21;
code_r0x0010fb59:
  impl = (JitAllocatorPrivateImpl *)
         (*(ulong *)(&(impl->super_Impl).options + (ulong)(uVar15 >> 0x1f) * 2) & 0xfffffffffffffffe
         );
  if (impl == (JitAllocatorPrivateImpl *)0x0) goto LAB_0010ff0c;
  goto LAB_0010fb39;
}

Assistant:

Error JitAllocator::release(void* rxPtr) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rxPtr))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rxPtr));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rxPtr - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->areaUsed() == 0) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}